

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O0

void SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
     ::_search_run_fn(search *sch)

{
  task_data *ptVar1;
  ostream *this;
  exception *this_00;
  search *in_RDI;
  task_data *d;
  
  ptVar1 = Search::search::get_task_data<HookTask::task_data>(in_RDI);
  if (((ptVar1->run_object != (void *)0x0) && (ptVar1->extra_data != (void *)0x0)) &&
     (ptVar1->extra_data2 != (void *)0x0)) {
    (**(code **)(*ptVar1->run_object + 0x10))
              (ptVar1->run_object,in_RDI,ptVar1->extra_data,ptVar1->extra_data2);
    return;
  }
  this = std::operator<<((ostream *)&std::cerr,
                         "error: calling _search_run_fn without setting run object");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void _search_run_fn(Search::search&sch)
  { HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    if ((d->run_object == NULL) || (d->extra_data == NULL) || (d->extra_data2 == NULL))
    { cerr << "error: calling _search_run_fn without setting run object" << endl;
      throw exception();
    }
    ((SearchTask*)d->run_object)->_run(sch, *(INPUT*)d->extra_data, *(OUTPUT*)d->extra_data2);
  }